

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cc
# Opt level: O3

string * __thiscall
kratos::full_path_abi_cxx11_(string *__return_storage_ptr__,kratos *this,Var *var)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  _func_int *local_38 [2];
  _func_int **local_28;
  pointer local_20;
  
  if (*(int *)(this + 0x168) == 3) {
    Var::as<kratos::Const>((Var *)&stack0xffffffffffffffd8);
    local_38[0] = local_28[0x4e];
    format_str.size_ = 3;
    format_str.data_ = (char *)0x3;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_38;
    fmt::v7::detail::vformat_abi_cxx11_(__return_storage_ptr__,(detail *)0x23c6ba,format_str,args);
    if (local_20 != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20);
    }
  }
  else {
    (**(code **)(*(long *)this + 0x100))(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string full_path(Var *var) {
    if (var->type() == VarType::ConstValue) {
        auto const &c = var->as<Const>();
        return fmt::format("{0}", c->value());
    } else {
        return var->handle_name();
    }
}